

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetCommandListAppendMetricMemoryBarrier(zet_command_list_handle_t hCommandList)

{
  zet_pfnCommandListAppendMetricMemoryBarrier_t pfnAppendMetricMemoryBarrier;
  ze_result_t result;
  zet_command_list_handle_t hCommandList_local;
  
  pfnAppendMetricMemoryBarrier._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c840 != (code *)0x0) {
    pfnAppendMetricMemoryBarrier._4_4_ = (*DAT_0011c840)(hCommandList);
  }
  return pfnAppendMetricMemoryBarrier._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMetricMemoryBarrier(
        zet_command_list_handle_t hCommandList          ///< [in] handle of the command list
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMetricMemoryBarrier = context.zetDdiTable.CommandList.pfnAppendMetricMemoryBarrier;
        if( nullptr != pfnAppendMetricMemoryBarrier )
        {
            result = pfnAppendMetricMemoryBarrier( hCommandList );
        }
        else
        {
            // generic implementation
        }

        return result;
    }